

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrogram.cpp
# Opt level: O0

int __thiscall ncnn::Spectrogram::load_param(Spectrogram *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  size_t in_RDI;
  float fVar2;
  double dVar3;
  int i_5;
  float sqsum;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  float *p;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  float *local_50;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,*(int *)(in_RDI + 0xd0) / 4);
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,*(int *)(in_RDI + 0xd0));
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 0xe0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,5,1);
  *(int *)(in_RDI + 0xe4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,6,2);
  *(int *)(in_RDI + 0xe8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,7,0);
  *(int *)(in_RDI + 0xec) = iVar1;
  iVar1 = ParamDict::get(in_RSI,8,1);
  *(int *)(in_RDI + 0xf0) = iVar1;
  if (*(int *)(in_RDI + 0xec) == 2) {
    iVar1 = *(int *)(in_RDI + 0xd0) + 1;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0xd0);
  }
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
              (int)(in_RDI + 0xf8 >> 0x20),in_RDI,
              (Allocator *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
  local_50 = *(float **)(in_RDI + 0xf8);
  for (local_54 = 0; local_54 < (*(int *)(in_RDI + 0xd0) - *(int *)(in_RDI + 0xdc)) / 2;
      local_54 = local_54 + 1) {
    *local_50 = 0.0;
    local_50 = local_50 + 1;
  }
  if (*(int *)(in_RDI + 0xe0) == 0) {
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0xdc); local_58 = local_58 + 1) {
      *local_50 = 1.0;
      local_50 = local_50 + 1;
    }
  }
  if (*(int *)(in_RDI + 0xe0) == 1) {
    for (local_5c = 0; local_5c < *(int *)(in_RDI + 0xdc); local_5c = local_5c + 1) {
      fVar2 = cosf(((float)local_5c * 6.2831855) / (float)*(int *)(in_RDI + 0xdc));
      *local_50 = (1.0 - fVar2) * 0.5;
      local_50 = local_50 + 1;
    }
  }
  if (*(int *)(in_RDI + 0xe0) == 2) {
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0xdc); local_60 = local_60 + 1) {
      fVar2 = cosf(((float)local_60 * 6.2831855) / (float)*(int *)(in_RDI + 0xdc));
      *local_50 = 0.54 - fVar2 * 0.46;
      local_50 = local_50 + 1;
    }
  }
  for (local_64 = 0;
      local_64 <
      (*(int *)(in_RDI + 0xd0) - *(int *)(in_RDI + 0xdc)) -
      (*(int *)(in_RDI + 0xd0) - *(int *)(in_RDI + 0xdc)) / 2; local_64 = local_64 + 1) {
    *local_50 = 0.0;
    local_50 = local_50 + 1;
  }
  if (*(int *)(in_RDI + 0xec) == 2) {
    local_68 = 0.0;
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0xd0); iVar1 = iVar1 + 1) {
      local_68 = *(float *)(*(long *)(in_RDI + 0xf8) + (long)iVar1 * 4) *
                 *(float *)(*(long *)(in_RDI + 0xf8) + (long)iVar1 * 4) + local_68;
    }
    dVar3 = std::sqrt((double)(ulong)(uint)local_68);
    *(float *)(*(long *)(in_RDI + 0xf8) + (long)*(int *)(in_RDI + 0xd0) * 4) = 1.0 / SUB84(dVar3,0);
  }
  return 0;
}

Assistant:

int Spectrogram::load_param(const ParamDict& pd)
{
    n_fft = pd.get(0, 0);
    power = pd.get(1, 0);
    hoplen = pd.get(2, n_fft / 4);
    winlen = pd.get(3, n_fft);
    window_type = pd.get(4, 0);
    center = pd.get(5, 1);
    pad_type = pd.get(6, 2);
    normalized = pd.get(7, 0);
    onesided = pd.get(8, 1);

    // assert winlen <= n_fft
    // generate window
    window_data.create(normalized == 2 ? n_fft + 1 : n_fft);
    {
        float* p = window_data;
        for (int i = 0; i < (n_fft - winlen) / 2; i++)
        {
            *p++ = 0.f;
        }
        if (window_type == 0)
        {
            // all ones
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 1.f;
            }
        }
        if (window_type == 1)
        {
            // hann window
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 0.5f * (1 - cosf(2 * 3.14159265358979323846 * i / winlen));
            }
        }
        if (window_type == 2)
        {
            // hamming window
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 0.54f - 0.46f * cosf(2 * 3.14159265358979323846 * i / winlen);
            }
        }
        for (int i = 0; i < n_fft - winlen - (n_fft - winlen) / 2; i++)
        {
            *p++ = 0.f;
        }

        // pre-calculated window norm factor
        if (normalized == 2)
        {
            float sqsum = 0.f;
            for (int i = 0; i < n_fft; i++)
            {
                sqsum += window_data[i] * window_data[i];
            }
            window_data[n_fft] = 1.f / sqrt(sqsum);
        }
    }

    return 0;
}